

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 FastJsonDecode(void *pIn,sxu32 nByte,jx9_value *pOut,uchar **pzPtr,int iNest)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  anon_union_8_3_18420de5_for_x *pObj;
  int iVar8;
  uchar *puVar9;
  int iVar10;
  bool bVar11;
  uchar *zIn;
  double iVal;
  jx9_value sKey;
  uchar *local_c8;
  jx9_hashmap *local_c0;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  jx9_vm *local_a8;
  jx9_vm *pjStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0x3f < iNest) {
    return -7;
  }
  puVar9 = (uchar *)((ulong)nByte + (long)pIn);
  bVar1 = *pIn;
  local_c8 = (uchar *)((long)pIn + 1);
  iVar5 = -0x18;
  uVar7 = bVar1 - 1;
  if (uVar7 < 10) {
    iVar8 = (int)puVar9;
    switch((uint)bVar1) {
    case 1:
      local_c0 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)CONCAT44(in_register_00000034,nByte),
                               (_func_sxu32_void_ptr_sxu32 *)
                               ((long)&switchD_0011a3a2::switchdataD_00143204 +
                               (long)(int)(&switchD_0011a3a2::switchdataD_00143204)[uVar7]));
      if (local_c0 != (jx9_hashmap *)0x0) {
        local_a8 = pOut->pVm;
        uStack_80 = 0;
        local_b8.rVal = 0.0;
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
        uStack_b0 = 0x20;
        uStack_40 = 0;
        local_78.rVal = 0.0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_70 = 0x20;
        pjStack_a0 = local_a8;
        local_68 = local_a8;
        pjStack_60 = local_a8;
        jx9MemObjRelease(pOut);
        pOut->iFlags = pOut->iFlags & 0xfffffe90U | 0x40;
        (pOut->x).pOther = local_c0;
        while (bVar11 = local_c8 < puVar9, bVar11) {
          uVar2 = *local_c8;
          while (uVar2 == '\x06') {
            local_c8 = local_c8 + 1;
            bVar11 = local_c8 < puVar9;
            if (!bVar11) goto LAB_0011a6fb;
            uVar2 = *local_c8;
          }
          if (!bVar11) break;
          if (*local_c8 == '\x02') {
            if (bVar11) {
              local_c8 = local_c8 + 1;
            }
            break;
          }
          iVar5 = FastJsonDecode(local_c8,iVar8 - (int)local_c8,(jx9_value *)&local_78,&local_c8,
                                 iNest + 1);
          if ((((iVar5 != 0) || (iVar5 = -0x18, puVar9 <= local_c8)) || (*local_c8 != '\x05')) ||
             (local_c8 = local_c8 + 1, puVar9 <= local_c8)) goto LAB_0011a6fe;
          iVar5 = FastJsonDecode(local_c8,iVar8 - (int)local_c8,(jx9_value *)&local_b8,&local_c8,
                                 iNest + 1);
          if ((iVar5 != 0) ||
             (iVar5 = HashmapInsert(local_c0,(jx9_value *)&local_78,(jx9_value *)&local_b8),
             iVar5 != 0)) goto LAB_0011a6fe;
        }
LAB_0011a6fb:
        iVar5 = 0;
LAB_0011a6fe:
        if (iVar5 != 0) {
          jx9MemObjRelease(pOut);
        }
        jx9MemObjRelease((jx9_value *)&local_b8);
        pObj = &local_78;
LAB_0011a71a:
        jx9MemObjRelease((jx9_value *)pObj);
        goto switchD_0011a32b_caseD_13;
      }
      break;
    default:
      goto switchD_0011a32b_caseD_13;
    case 3:
      local_c0 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)CONCAT44(in_register_00000034,nByte),
                               (_func_sxu32_void_ptr_sxu32 *)
                               ((long)&switchD_0011a3a2::switchdataD_00143204 +
                               (long)(int)(&switchD_0011a3a2::switchdataD_00143204)[uVar7]));
      if (local_c0 != (jx9_hashmap *)0x0) {
        local_a8 = pOut->pVm;
        uStack_80 = 0;
        local_b8.rVal = 0.0;
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
        uStack_b0 = 0x20;
        pjStack_a0 = local_a8;
        jx9MemObjRelease(pOut);
        pOut->iFlags = pOut->iFlags & 0xfffffe90U | 0x40;
        (pOut->x).pOther = local_c0;
        iVar10 = 0;
        while (bVar11 = local_c8 < puVar9, iVar5 = iVar10, bVar11) {
          uVar2 = *local_c8;
          while (uVar2 == '\x06') {
            local_c8 = local_c8 + 1;
            bVar11 = local_c8 < puVar9;
            if (!bVar11) goto LAB_0011a6dc;
            uVar2 = *local_c8;
          }
          if (!bVar11) break;
          if (*local_c8 == '\x04') {
            iVar5 = 0;
            if (bVar11) {
              local_c8 = local_c8 + 1;
            }
            break;
          }
          iVar5 = FastJsonDecode(local_c8,iVar8 - (int)local_c8,(jx9_value *)&local_b8,&local_c8,
                                 iNest + 1);
          if ((iVar5 != 0) ||
             (iVar5 = HashmapInsert(local_c0,(jx9_value *)0x0,(jx9_value *)&local_b8), iVar5 != 0))
          break;
        }
LAB_0011a6dc:
        if (iVar5 != 0) {
          jx9MemObjRelease(pOut);
        }
        pObj = &local_b8;
        goto LAB_0011a71a;
      }
      break;
    case 8:
      if (5 < nByte) {
        uVar7 = *(uint *)((long)pIn + 1);
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (local_c8 + uVar7 < puVar9) {
          local_c8 = (uchar *)((long)pIn + 5);
          if ((pOut->iFlags & 1) != 0) {
            (pOut->sBlob).nByte = 0;
            uVar3 = (pOut->sBlob).nFlags;
            if ((uVar3 & 4) != 0) {
              (pOut->sBlob).pBlob = (void *)0x0;
              (pOut->sBlob).mByte = 0;
              (pOut->sBlob).nFlags = uVar3 & 0xfffffffb;
            }
          }
          iVar5 = jx9MemObjStringAppend(pOut,(char *)local_c8,uVar7);
          local_c8 = local_c8 + uVar7;
        }
      }
      goto switchD_0011a32b_caseD_13;
    case 10:
      if (nByte < 10) goto switchD_0011a32b_caseD_13;
      uVar4 = *(ulong *)((long)pIn + 1);
      local_c8 = (uchar *)((long)pIn + 9);
      jx9MemObjRelease(pOut);
      (pOut->x).iVal =
           uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      uVar7 = pOut->iFlags & 0xfffffe90U | 2;
      goto LAB_0011a6b6;
    }
    iVar5 = -1;
    goto switchD_0011a32b_caseD_13;
  }
  switch(bVar1) {
  case 0x12:
    local_b8.rVal = 0.0;
    iVar5 = -0x18;
    if (nByte < 4) goto switchD_0011a32b_caseD_13;
    uVar6 = *(ushort *)((long)pIn + 1) << 8 | *(ushort *)((long)pIn + 1) >> 8;
    if (puVar9 <= local_c8 + uVar6) goto switchD_0011a32b_caseD_13;
    puVar9 = (uchar *)((long)pIn + 3);
    local_c8 = puVar9;
    SyStrToReal((char *)puVar9,(uint)uVar6,&local_b8,(char **)(ulong)uVar6);
    local_c8 = puVar9 + uVar6;
    jx9_value_double(pOut,local_b8.rVal);
    break;
  default:
    goto switchD_0011a32b_caseD_13;
  case 0x17:
    jx9MemObjRelease(pOut);
    break;
  case 0x18:
    jx9MemObjRelease(pOut);
    (pOut->x).rVal = 4.94065645841247e-324;
    goto LAB_0011a6aa;
  case 0x19:
    jx9MemObjRelease(pOut);
    (pOut->x).rVal = 0.0;
LAB_0011a6aa:
    uVar7 = pOut->iFlags & 0xfffffe90U | 8;
LAB_0011a6b6:
    pOut->iFlags = uVar7;
  }
  iVar5 = 0;
switchD_0011a32b_caseD_13:
  if (pzPtr != (uchar **)0x0) {
    *pzPtr = local_c8;
  }
  return iVar5;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonDecode(
	const void *pIn,  /* Binary JSON  */
	sxu32 nByte,      /* Chunk delimiter */
	jx9_value *pOut,  /* Decoded value */
	const unsigned char **pzPtr,
	int iNest /* Nesting limit */
	)
{
	const unsigned char *zIn = (const unsigned char *)pIn;
	const unsigned char *zEnd = &zIn[nByte];
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	c = zIn[0];
	/* Advance the stream cursor */
	zIn++;
	/* Process the binary token */
	switch(c){
	case FJSON_NULL:
		/* null */
		jx9_value_null(pOut);
		break;
	case FJSON_FALSE:
		/* Boolean FALSE */
		jx9_value_bool(pOut,0);
		break;
	case FJSON_TRUE:
		/* Boolean TRUE */
		jx9_value_bool(pOut,1);
		break;
	case FJSON_INT64: {
		/* 64Bit integer */
		sxu64 iVal;
		/* Sanity check */
		if( &zIn[8] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack64(zIn,&iVal);
		/* Advance the pointer */
		zIn += 8;
		jx9_value_int64(pOut,(jx9_int64)iVal);
		break;
					  }
	case FJSON_REAL: {
		/* Real number */
		double iVal = 0; /* cc warning */
		sxu16 iLen;
		/* Sanity check */
		if( &zIn[2] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack16(zIn,&iLen);
		if( &zIn[iLen] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 2;
		SyStrToReal((const char *)zIn,(sxu32)iLen,&iVal,0);
		/* Advance the pointer */
		zIn += iLen;
		jx9_value_double(pOut,iVal);
		break;
					 }
	case FJSON_STRING: {
		/* UTF-8/Binary chunk */
		sxu32 iLength;
		/* Sanity check */
		if( &zIn[4] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack32(zIn,&iLength);
		if( &zIn[iLength] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 4;
		/* Invalidate any prior representation */
		if( pOut->iFlags & MEMOBJ_STRING ){
			/* Reset the string cursor */
			SyBlobReset(&pOut->sBlob);
		}
		rc = jx9MemObjStringAppend(pOut,(const char *)zIn,iLength);
		/* Update pointer */
		zIn += iLength;
		break;
					   }
	case FJSON_ARRAY_START: {
		/* Binary JSON array */
		jx9_hashmap *pMap;
		jx9_value sVal;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_ARRAY_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary ] */
				}
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the decoded value */
			rc = jx9HashmapInsert(pMap,0,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		break;
							}
	case FJSON_DOC_START: {
		/* Binary JSON object */
		jx9_value sVal,sKey;
		jx9_hashmap *pMap;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjInit(pOut->pVm,&sKey);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_DOC_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary } */
				}
				break;
			}
			/* Extract the key */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sKey,&zIn,iNest+1);
			if( rc != UNQLITE_OK ){
				break;
			}
			if( zIn >= zEnd || zIn[0] != FJSON_COLON ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			zIn++; /* Jump the binary colon ':' */
			if( zIn >= zEnd ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the key and its associated value */
			rc = jx9HashmapInsert(pMap,&sKey,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		jx9MemObjRelease(&sKey);
		break;
						  }
	default:
		/* Corrupt data */
		rc = SXERR_CORRUPT;
		break;
	}
	if( pzPtr ){
		*pzPtr = zIn;
	}
	return rc;
}